

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<std::pair<unsigned_long,unsigned_long>>::
emplace_back<std::pair<unsigned_long,unsigned_long>>
          (SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *this,
          pair<unsigned_long,_unsigned_long> *args)

{
  ulong uVar1;
  SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *p;
  unsigned_long uVar2;
  unsigned_long *puVar3;
  unsigned_long *puVar4;
  SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *pSVar5;
  long lVar6;
  SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *__src;
  long lVar7;
  ulong uVar8;
  
  __src = (SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *)
          (*(long *)(this + 8) * 0x10 + *(long *)this);
  if (*(long *)(this + 8) != *(long *)(this + 0x10)) {
    uVar2 = args->second;
    *(unsigned_long *)__src = args->first;
    *(unsigned_long *)(__src + 8) = uVar2;
    lVar7 = *(long *)(this + 8);
    *(long *)(this + 8) = lVar7 + 1;
    return (reference)(*(long *)this + (lVar7 + 1) * 0x10 + -0x10);
  }
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar8 = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar8 < uVar1 * 2) {
    uVar8 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar8 = 0x7ffffffffffffff;
  }
  lVar6 = (long)__src - *(long *)this;
  puVar3 = (unsigned_long *)operator_new(uVar8 << 4);
  uVar2 = args->second;
  *(unsigned_long *)((long)puVar3 + lVar6) = args->first;
  ((unsigned_long *)((long)puVar3 + lVar6))[1] = uVar2;
  p = *(SmallVectorBase<std::pair<unsigned_long,unsigned_long>> **)this;
  lVar7 = *(long *)(this + 8);
  pSVar5 = p;
  puVar4 = puVar3;
  if (p + (lVar7 * 0x10 - (long)__src) ==
      (SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *)0x0) {
    if (lVar7 != 0) {
      do {
        uVar2 = *(unsigned_long *)(pSVar5 + 8);
        *puVar4 = *(unsigned_long *)pSVar5;
        puVar4[1] = uVar2;
        pSVar5 = pSVar5 + 0x10;
        puVar4 = puVar4 + 2;
      } while (pSVar5 != __src);
    }
  }
  else {
    for (; pSVar5 != __src; pSVar5 = pSVar5 + 0x10) {
      uVar2 = *(unsigned_long *)(pSVar5 + 8);
      *puVar4 = *(unsigned_long *)pSVar5;
      puVar4[1] = uVar2;
      puVar4 = puVar4 + 2;
    }
    memcpy((void *)((long)puVar3 + lVar6 + 0x10),__src,
           ((ulong)(p + (lVar7 * 0x10 - (long)__src) + -0x10) & 0xfffffffffffffff0) + 0x10);
  }
  if (p != this + 0x18) {
    operator_delete(p);
    lVar7 = *(long *)(this + 8);
  }
  *(long *)(this + 8) = lVar7 + 1;
  *(ulong *)(this + 0x10) = uVar8;
  *(unsigned_long **)this = puVar3;
  return (reference)((long)puVar3 + lVar6);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }